

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_compress.c
# Opt level: O3

void deflate_optimize_and_flush_block
               (libdeflate_compressor *c,deflate_output_bitstream *os,u8 *block_begin,
               u32 block_length,lz_match *cache_ptr,_Bool is_first_block,_Bool is_final_block,
               _Bool *used_only_literals)

{
  u32 *puVar1;
  void *pvVar2;
  void *pvVar3;
  deflate_lens *lens;
  int *piVar4;
  uint *puVar5;
  byte bVar6;
  byte bVar7;
  u32 uVar8;
  u32 uVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  deflate_sequence *sequences;
  int iVar17;
  int iVar21;
  long lVar18;
  int iVar22;
  undefined1 auVar19 [16];
  int iVar24;
  long lVar23;
  undefined1 auVar20 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  deflate_sequence seq_;
  uint local_5c;
  uint local_44;
  deflate_sequence local_38;
  
  local_44 = (c->p).n.max_optim_passes;
  deflate_choose_all_literals(c,block_begin,block_length);
  uVar8 = deflate_compute_true_cost(c);
  auVar26 = _DAT_0010d0b0;
  auVar25 = _DAT_0010d0a0;
  auVar28 = _DAT_0010d090;
  uVar16 = 0x4a767;
  if (block_length + 0x101 < 0x4a768) {
    uVar16 = block_length + 0x101;
  }
  uVar14 = (ulong)block_length;
  uVar12 = uVar16 - block_length;
  if (block_length <= uVar16) {
    auVar19._4_4_ = 0;
    auVar19._0_4_ = uVar12;
    auVar19._8_4_ = uVar12;
    auVar19._12_4_ = 0;
    uVar15 = 0;
    auVar19 = auVar19 ^ _DAT_0010d090;
    do {
      auVar27._8_4_ = (int)uVar15;
      auVar27._0_8_ = uVar15;
      auVar27._12_4_ = (int)(uVar15 >> 0x20);
      auVar30 = (auVar27 | auVar26) ^ auVar28;
      iVar17 = auVar19._4_4_;
      if ((bool)(~(auVar30._4_4_ == iVar17 && auVar19._0_4_ < auVar30._0_4_ ||
                  iVar17 < auVar30._4_4_) & 1)) {
        *(undefined4 *)((long)&c->p + uVar15 * 8 + uVar14 * 8 + 0x639584) = 0x80000000;
      }
      if ((auVar30._12_4_ != auVar19._12_4_ || auVar30._8_4_ <= auVar19._8_4_) &&
          auVar30._12_4_ <= auVar19._12_4_) {
        *(undefined4 *)((long)&c->p + uVar15 * 8 + uVar14 * 8 + 0x63958c) = 0x80000000;
      }
      auVar27 = (auVar27 | auVar25) ^ auVar28;
      iVar21 = auVar27._4_4_;
      if (iVar21 <= iVar17 && (iVar21 != iVar17 || auVar27._0_4_ <= auVar19._0_4_)) {
        *(undefined4 *)((long)&c->p + uVar15 * 8 + uVar14 * 8 + 0x639594) = 0x80000000;
        *(undefined4 *)((long)&c->p + uVar15 * 8 + uVar14 * 8 + 0x63959c) = 0x80000000;
      }
      uVar15 = uVar15 + 4;
    } while (((ulong)uVar12 + 4 & 0xfffffffffffffffc) != uVar15);
  }
  if ((c->p).n.max_len_to_optimize_static_block < block_length) {
    memset(&c->freqs,0,0x400);
    local_5c = 0xffffffff;
LAB_0010752b:
    uVar15 = 0;
    do {
      puVar1 = (c->freqs).litlen + block_begin[uVar15];
      *puVar1 = *puVar1 + 1;
      uVar15 = uVar15 + 1;
    } while (uVar14 != uVar15);
    uVar16 = block_length >> 0xb;
  }
  else {
    pvVar2 = (void *)((long)&c->p + 0x88d950);
    pvVar3 = (void *)((long)&c->p + 0x88d0c4);
    memcpy(pvVar2,pvVar3,0x88c);
    deflate_set_costs_from_codes(c,&(c->static_codes).lens);
    deflate_find_min_cost_path(c,block_length,cache_ptr);
    local_5c = ((c->p).n.optimum_nodes[0].cost_to_end >> 4) + 7;
    memcpy(pvVar3,pvVar2,0x88c);
    uVar16 = 0;
    memset(&c->freqs,0,0x400);
    if (block_length != 0) goto LAB_0010752b;
  }
  iVar17 = 0;
  iVar21 = 0;
  iVar22 = 0;
  iVar24 = 0;
  lVar11 = 0;
  do {
    puVar1 = (c->freqs).litlen + lVar11;
    iVar17 = iVar17 + (uint)((int)(uVar16 | 0x80000000) < (int)(*puVar1 ^ 0x80000000));
    iVar21 = iVar21 + (uint)((int)(uVar16 | 0x80000000) < (int)(puVar1[1] ^ 0x80000000));
    iVar22 = iVar22 + (uint)((int)(uVar16 | 0x80000000) < (int)(puVar1[2] ^ 0x80000000));
    iVar24 = iVar24 + (uint)((int)(uVar16 | 0x80000000) < (int)(puVar1[3] ^ 0x80000000));
    lVar11 = lVar11 + 4;
  } while (lVar11 != 0x100);
  iVar17 = iVar24 + iVar21 + iVar22 + iVar17;
  uVar12 = iVar17 + (uint)(iVar17 == 0);
  uVar9 = choose_min_match_len(uVar12,c->max_search_depth);
  uVar14 = (ulong)uVar9;
  uVar16 = 0;
  uVar9 = block_length;
  do {
    iVar17 = *(int *)((long)&c->p + uVar14 * 4 + 0x896618);
    uVar16 = uVar16 + iVar17;
    uVar9 = uVar9 - (int)uVar14 * iVar17;
    uVar14 = uVar14 + 1;
  } while (uVar14 != 0x103);
  uVar13 = 0;
  if (0 < (int)uVar9) {
    uVar13 = uVar9;
  }
  uVar10 = 2;
  if (uVar16 <= uVar13) {
    uVar10 = (uint)(uVar13 < uVar16 * 4);
  }
  bVar6 = default_litlen_costs[0].used_lits_to_lit_cost[(ulong)uVar12 + (ulong)(uVar10 * 0x102)];
  bVar7 = (&default_litlen_costs[0].len_sym_cost)[uVar10 * 0x102];
  uVar16 = CONCAT31(0,bVar6);
  if (is_first_block) {
LAB_001076eb:
    auVar20[4] = bVar6;
    auVar20._0_4_ = uVar16;
    auVar20._5_3_ = 0;
    auVar20[8] = bVar6;
    auVar20._9_3_ = 0;
    auVar20[0xc] = bVar6;
    auVar20._13_3_ = 0;
    lVar11 = 0;
    do {
      *(undefined1 (*) [16])((long)&c->p + lVar11 * 4 + 0x88d0c4) = auVar20;
      lVar11 = lVar11 + 4;
    } while (lVar11 != 0x100);
    lVar11 = 0;
    do {
      *(uint *)((long)&c->p + lVar11 * 4 + 0x88d4d0) = (uint)""[""[lVar11 + 3]] * 0x10 + (uint)bVar7
      ;
      lVar11 = lVar11 + 1;
    } while (lVar11 != 0x100);
    lVar11 = 0;
    do {
      *(uint *)((long)&c->p + lVar11 * 4 + 0x88d8d0) = (uint)""[lVar11] * 0x10 + 0x4e;
      lVar11 = lVar11 + 1;
    } while (lVar11 != 0x1e);
  }
  else {
    uVar12 = (c->split_stats).num_observations;
    uVar13 = (c->p).n.prev_num_observations;
    lVar18 = 0;
    lVar23 = 0;
    lVar11 = 0;
    do {
      uVar14 = *(ulong *)((long)&c->p + lVar11 * 4 + 0x8961e0);
      auVar28._0_8_ = (uVar14 & 0xffffffff) * (ulong)uVar12;
      auVar28._8_8_ = (uVar14 >> 0x20) * (ulong)uVar12;
      uVar14 = *(ulong *)((c->split_stats).observations + lVar11);
      auVar26._0_8_ = (uVar14 & 0xffffffff) * (ulong)uVar13;
      auVar26._8_8_ = (uVar14 >> 0x20) * (ulong)uVar13;
      auVar25._0_8_ = auVar28._0_8_ - auVar26._0_8_;
      auVar25._8_8_ = auVar28._8_8_ - auVar26._8_8_;
      auVar26 = auVar26 ^ _DAT_0010d090;
      auVar28 = auVar28 ^ _DAT_0010d090;
      iVar17 = -(uint)(auVar26._0_4_ < auVar28._0_4_);
      iVar22 = -(uint)(auVar26._4_4_ < auVar28._4_4_);
      iVar21 = -(uint)(auVar26._8_4_ < auVar28._8_4_);
      iVar24 = -(uint)(auVar26._12_4_ < auVar28._12_4_);
      auVar31._4_4_ = iVar17;
      auVar31._0_4_ = iVar17;
      auVar31._8_4_ = iVar21;
      auVar31._12_4_ = iVar21;
      iVar17 = -(uint)(auVar28._4_4_ == auVar26._4_4_);
      iVar21 = -(uint)(auVar28._12_4_ == auVar26._12_4_);
      auVar30._4_4_ = iVar17;
      auVar30._0_4_ = iVar17;
      auVar30._8_4_ = iVar21;
      auVar30._12_4_ = iVar21;
      auVar29._4_4_ = iVar22;
      auVar29._0_4_ = iVar22;
      auVar29._8_4_ = iVar24;
      auVar29._12_4_ = iVar24;
      auVar29 = auVar29 | auVar30 & auVar31;
      lVar18 = lVar18 + (auVar29._0_8_ - SUB168(auVar25 ^ auVar29,0));
      lVar23 = lVar23 + (auVar29._8_8_ - SUB168(auVar25 ^ auVar29,8));
      lVar11 = lVar11 + 2;
    } while (lVar11 != 10);
    uVar15 = lVar23 + lVar18;
    uVar14 = (ulong)uVar12 * (ulong)uVar13 * 200 >> 9;
    if (uVar14 * 3 < uVar15) goto LAB_001076eb;
    if (uVar15 * 4 < uVar14 * 9 || uVar15 * 4 + uVar14 * -9 == 0) {
      if (uVar14 * 3 < uVar15 * 2) {
        iVar17 = (uint)bVar6 + (uint)bVar6 * 4;
        lVar11 = 0;
        do {
          piVar4 = (int *)((long)&c->p + lVar11 * 4 + 0x88d0c4);
          iVar21 = piVar4[1];
          iVar22 = piVar4[2];
          iVar24 = piVar4[3];
          puVar5 = (uint *)((long)&c->p + lVar11 * 4 + 0x88d0c4);
          *puVar5 = (uint)(*piVar4 * 3 + iVar17) >> 3;
          puVar5[1] = (uint)(iVar21 * 3 + iVar17) >> 3;
          puVar5[2] = (uint)(iVar22 * 3 + iVar17) >> 3;
          puVar5[3] = (uint)(iVar24 * 3 + iVar17) >> 3;
          lVar11 = lVar11 + 4;
        } while (lVar11 != 0x100);
        lVar11 = 0;
        do {
          *(uint *)((long)&c->p + lVar11 * 4 + 0x88d4d0) =
               *(int *)((long)&c->p + lVar11 * 4 + 0x88d4d0) * 3 +
               ((uint)""[""[lVar11 + 3]] * 0x10 + (uint)bVar7) * 5 >> 3;
          lVar11 = lVar11 + 1;
        } while (lVar11 != 0x100);
        lVar11 = 0;
        do {
          *(uint *)((long)&c->p + lVar11 * 4 + 0x88d8d0) =
               ((uint)""[lVar11] + (uint)""[lVar11] * 4) * 0x10 +
               *(int *)((long)&c->p + lVar11 * 4 + 0x88d8d0) * 3 + 0x186 >> 3;
          lVar11 = lVar11 + 1;
        } while (lVar11 != 0x1e);
      }
      else {
        lVar11 = 0;
        if (uVar14 < uVar15 * 2) {
          do {
            piVar4 = (int *)((long)&c->p + lVar11 * 4 + 0x88d0c4);
            iVar17 = piVar4[1];
            iVar21 = piVar4[2];
            iVar22 = piVar4[3];
            puVar5 = (uint *)((long)&c->p + lVar11 * 4 + 0x88d0c4);
            *puVar5 = *piVar4 + uVar16 >> 1;
            puVar5[1] = iVar17 + uVar16 >> 1;
            puVar5[2] = iVar21 + uVar16 >> 1;
            puVar5[3] = iVar22 + uVar16 >> 1;
            lVar11 = lVar11 + 4;
          } while (lVar11 != 0x100);
          lVar11 = 0;
          do {
            *(uint *)((long)&c->p + lVar11 * 4 + 0x88d4d0) =
                 *(int *)((long)&c->p + lVar11 * 4 + 0x88d4d0) + (uint)bVar7 +
                 (uint)""[""[lVar11 + 3]] * 0x10 >> 1;
            lVar11 = lVar11 + 1;
          } while (lVar11 != 0x100);
          lVar11 = 0;
          do {
            *(uint *)((long)&c->p + lVar11 * 4 + 0x88d8d0) =
                 (uint)""[lVar11] * 0x10 + *(int *)((long)&c->p + lVar11 * 4 + 0x88d8d0) + 0x4e >> 1
            ;
            lVar11 = lVar11 + 1;
          } while (lVar11 != 0x1e);
        }
        else {
          do {
            piVar4 = (int *)((long)&c->p + lVar11 * 4 + 0x88d0c4);
            iVar17 = piVar4[1];
            iVar21 = piVar4[2];
            iVar22 = piVar4[3];
            puVar5 = (uint *)((long)&c->p + lVar11 * 4 + 0x88d0c4);
            *puVar5 = *piVar4 * 3 + uVar16 >> 2;
            puVar5[1] = iVar17 * 3 + uVar16 >> 2;
            puVar5[2] = iVar21 * 3 + uVar16 >> 2;
            puVar5[3] = iVar22 * 3 + uVar16 >> 2;
            lVar11 = lVar11 + 4;
          } while (lVar11 != 0x100);
          lVar11 = 0;
          do {
            *(uint *)((long)&c->p + lVar11 * 4 + 0x88d4d0) =
                 *(int *)((long)&c->p + lVar11 * 4 + 0x88d4d0) * 3 + (uint)bVar7 +
                 (uint)""[""[lVar11 + 3]] * 0x10 >> 2;
            lVar11 = lVar11 + 1;
          } while (lVar11 != 0x100);
          lVar11 = 0;
          do {
            *(uint *)((long)&c->p + lVar11 * 4 + 0x88d8d0) =
                 (uint)""[lVar11] * 0x10 + *(int *)((long)&c->p + lVar11 * 4 + 0x88d8d0) * 3 + 0x4e
                 >> 2;
            lVar11 = lVar11 + 1;
          } while (lVar11 != 0x1e);
        }
      }
    }
    else {
      iVar17 = (uint)bVar6 + (uint)bVar6 * 2;
      lVar11 = 0;
      do {
        piVar4 = (int *)((long)&c->p + lVar11 * 4 + 0x88d0c4);
        iVar21 = piVar4[1];
        iVar22 = piVar4[2];
        iVar24 = piVar4[3];
        puVar5 = (uint *)((long)&c->p + lVar11 * 4 + 0x88d0c4);
        *puVar5 = (uint)(*piVar4 + iVar17) >> 2;
        puVar5[1] = (uint)(iVar21 + iVar17) >> 2;
        puVar5[2] = (uint)(iVar22 + iVar17) >> 2;
        puVar5[3] = (uint)(iVar24 + iVar17) >> 2;
        lVar11 = lVar11 + 4;
      } while (lVar11 != 0x100);
      lVar11 = 0;
      do {
        *(uint *)((long)&c->p + lVar11 * 4 + 0x88d4d0) =
             ((uint)""[""[lVar11 + 3]] * 0x10 + (uint)bVar7) * 3 +
             *(int *)((long)&c->p + lVar11 * 4 + 0x88d4d0) >> 2;
        lVar11 = lVar11 + 1;
      } while (lVar11 != 0x100);
      lVar11 = 0;
      do {
        *(uint *)((long)&c->p + lVar11 * 4 + 0x88d8d0) =
             ((uint)""[lVar11] + (uint)""[lVar11] * 2) * 0x10 +
             *(int *)((long)&c->p + lVar11 * 4 + 0x88d8d0) + 0xea >> 2;
        lVar11 = lVar11 + 1;
      } while (lVar11 != 0x1e);
    }
  }
  pvVar2 = (void *)((long)&c->p + 0x88d950);
  pvVar3 = (void *)((long)&c->p + 0x88d0c4);
  lens = &(c->codes).lens;
  uVar16 = 0xffffffff;
  do {
    deflate_find_min_cost_path(c,block_length,cache_ptr);
    uVar9 = deflate_compute_true_cost(c);
    if (uVar16 < (c->p).n.min_improvement_to_continue + uVar9) break;
    memcpy(pvVar2,pvVar3,0x88c);
    deflate_set_costs_from_codes(c,lens);
    local_44 = local_44 - 1;
    uVar16 = uVar9;
  } while (local_44 != 0);
  *used_only_literals = false;
  uVar12 = local_5c;
  if (uVar8 < local_5c) {
    uVar12 = uVar8;
  }
  if (uVar12 < uVar16) {
    if (uVar8 < local_5c) {
      deflate_choose_all_literals(c,block_begin,block_length);
      deflate_set_costs_from_codes(c,lens);
      sequences = &local_38;
      *used_only_literals = true;
      local_38.litrunlen_and_length = block_length;
      goto LAB_00107975;
    }
    deflate_set_costs_from_codes(c,&(c->static_codes).lens);
    deflate_find_min_cost_path(c,block_length,cache_ptr);
  }
  else if (uVar16 + (c->p).n.min_bits_to_use_nonfinal_path <= uVar9) {
    memcpy(pvVar3,pvVar2,0x88c);
    deflate_find_min_cost_path(c,block_length,cache_ptr);
    deflate_set_costs_from_codes(c,lens);
  }
  sequences = (deflate_sequence *)0x0;
LAB_00107975:
  deflate_flush_block(c,os,block_begin,block_length,sequences,is_final_block);
  return;
}

Assistant:

static void
deflate_optimize_and_flush_block(struct libdeflate_compressor *c,
				 struct deflate_output_bitstream *os,
				 const u8 *block_begin, u32 block_length,
				 const struct lz_match *cache_ptr,
				 bool is_first_block, bool is_final_block,
				 bool *used_only_literals)
{
	unsigned num_passes_remaining = c->p.n.max_optim_passes;
	u32 best_true_cost = UINT32_MAX;
	u32 true_cost;
	u32 only_lits_cost;
	u32 static_cost = UINT32_MAX;
	struct deflate_sequence seq_;
	struct deflate_sequence *seq = NULL;
	u32 i;

	/*
	 * On some data, using only literals (no matches) ends up being better
	 * than what the iterative optimization algorithm produces.  Therefore,
	 * consider using only literals.
	 */
	deflate_choose_all_literals(c, block_begin, block_length);
	only_lits_cost = deflate_compute_true_cost(c);

	/*
	 * Force the block to really end at the desired length, even if some
	 * matches extend beyond it.
	 */
	for (i = block_length;
	     i <= MIN(block_length - 1 + DEFLATE_MAX_MATCH_LEN,
		      ARRAY_LEN(c->p.n.optimum_nodes) - 1); i++)
		c->p.n.optimum_nodes[i].cost_to_end = 0x80000000;

	/*
	 * Sometimes a static Huffman block ends up being cheapest, particularly
	 * if the block is small.  So, if the block is sufficiently small, find
	 * the optimal static block solution and remember its cost.
	 */
	if (block_length <= c->p.n.max_len_to_optimize_static_block) {
		/* Save c->p.n.costs temporarily. */
		c->p.n.costs_saved = c->p.n.costs;

		deflate_set_costs_from_codes(c, &c->static_codes.lens);
		deflate_find_min_cost_path(c, block_length, cache_ptr);
		static_cost = c->p.n.optimum_nodes[0].cost_to_end / BIT_COST;
		static_cost += 7; /* for the end-of-block symbol */

		/* Restore c->p.n.costs. */
		c->p.n.costs = c->p.n.costs_saved;
	}

	/* Initialize c->p.n.costs with default costs. */
	deflate_set_initial_costs(c, block_begin, block_length, is_first_block);

	do {
		/*
		 * Find the minimum-cost path for this pass.
		 * Also set c->freqs and c->codes to match the path.
		 */
		deflate_find_min_cost_path(c, block_length, cache_ptr);

		/*
		 * Compute the exact cost of the block if the path were to be
		 * used.  Note that this differs from
		 * c->p.n.optimum_nodes[0].cost_to_end in that true_cost uses
		 * the actual Huffman codes instead of c->p.n.costs.
		 */
		true_cost = deflate_compute_true_cost(c);

		/*
		 * If the cost didn't improve much from the previous pass, then
		 * doing more passes probably won't be helpful, so stop early.
		 */
		if (true_cost + c->p.n.min_improvement_to_continue >
		    best_true_cost)
			break;

		best_true_cost = true_cost;

		/* Save the cost model that gave 'best_true_cost'. */
		c->p.n.costs_saved = c->p.n.costs;

		/* Update the cost model from the Huffman codes. */
		deflate_set_costs_from_codes(c, &c->codes.lens);

	} while (--num_passes_remaining);

	*used_only_literals = false;
	if (MIN(only_lits_cost, static_cost) < best_true_cost) {
		if (only_lits_cost < static_cost) {
			/* Using only literals ended up being best! */
			deflate_choose_all_literals(c, block_begin, block_length);
			deflate_set_costs_from_codes(c, &c->codes.lens);
			seq_.litrunlen_and_length = block_length;
			seq = &seq_;
			*used_only_literals = true;
		} else {
			/* Static block ended up being best! */
			deflate_set_costs_from_codes(c, &c->static_codes.lens);
			deflate_find_min_cost_path(c, block_length, cache_ptr);
		}
	} else if (true_cost >=
		   best_true_cost + c->p.n.min_bits_to_use_nonfinal_path) {
		/*
		 * The best solution was actually from a non-final optimization
		 * pass, so recover and use the min-cost path from that pass.
		 */
		c->p.n.costs = c->p.n.costs_saved;
		deflate_find_min_cost_path(c, block_length, cache_ptr);
		deflate_set_costs_from_codes(c, &c->codes.lens);
	}
	deflate_flush_block(c, os, block_begin, block_length, seq,
			    is_final_block);
}